

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

ChromeCompositorSchedulerState * __thiscall
perfetto::protos::gen::ChromeCompositorSchedulerState::operator=
          (ChromeCompositorSchedulerState *this,ChromeCompositorSchedulerState *param_1)

{
  _Head_base<0UL,_perfetto::protos::gen::CompositorTimingHistory_*,_false> _Var1;
  _Head_base<0UL,_perfetto::protos::gen::CompositorTimingHistory_*,_false> _Var2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ChromeCompositorSchedulerAction CVar11;
  ChromeCompositorSchedulerState_BeginImplFrameDeadlineMode CVar12;
  undefined4 uVar13;
  
  ChromeCompositorStateMachine::operator=
            ((this->state_machine_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeCompositorStateMachine,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_*,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_*,_false>.
             _M_head_impl,
             (param_1->state_machine_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ChromeCompositorStateMachine,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_*,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_*,_false>.
             _M_head_impl);
  bVar8 = param_1->begin_impl_frame_deadline_task_;
  bVar9 = param_1->pending_begin_frame_task_;
  bVar10 = param_1->skipped_last_frame_missed_exceeded_deadline_;
  CVar11 = param_1->inside_action_;
  CVar12 = param_1->deadline_mode_;
  uVar13 = *(undefined4 *)&param_1->field_0x1c;
  iVar3 = param_1->deadline_us_;
  iVar4 = param_1->deadline_scheduled_at_us_;
  iVar5 = param_1->now_us_;
  iVar6 = param_1->now_to_deadline_delta_us_;
  this->observing_begin_frame_source_ = param_1->observing_begin_frame_source_;
  this->begin_impl_frame_deadline_task_ = bVar8;
  this->pending_begin_frame_task_ = bVar9;
  this->skipped_last_frame_missed_exceeded_deadline_ = bVar10;
  this->inside_action_ = CVar11;
  this->deadline_mode_ = CVar12;
  *(undefined4 *)&this->field_0x1c = uVar13;
  this->deadline_us_ = iVar3;
  this->deadline_scheduled_at_us_ = iVar4;
  this->now_us_ = iVar5;
  this->now_to_deadline_delta_us_ = iVar6;
  this->now_to_deadline_scheduled_at_delta_us_ = param_1->now_to_deadline_scheduled_at_delta_us_;
  BeginImplFrameArgs::operator=
            ((this->begin_impl_frame_args_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::BeginImplFrameArgs,_std::default_delete<perfetto::protos::gen::BeginImplFrameArgs>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::BeginImplFrameArgs_*,_std::default_delete<perfetto::protos::gen::BeginImplFrameArgs>_>
             .super__Head_base<0UL,_perfetto::protos::gen::BeginImplFrameArgs_*,_false>._M_head_impl
             ,(param_1->begin_impl_frame_args_).ptr_._M_t.
              super___uniq_ptr_impl<perfetto::protos::gen::BeginImplFrameArgs,_std::default_delete<perfetto::protos::gen::BeginImplFrameArgs>_>
              ._M_t.
              super__Tuple_impl<0UL,_perfetto::protos::gen::BeginImplFrameArgs_*,_std::default_delete<perfetto::protos::gen::BeginImplFrameArgs>_>
              .super__Head_base<0UL,_perfetto::protos::gen::BeginImplFrameArgs_*,_false>.
              _M_head_impl);
  protozero::CopyablePtr<perfetto::protos::gen::BeginFrameObserverState>::operator=
            (&this->begin_frame_observer_state_,&param_1->begin_frame_observer_state_);
  protozero::CopyablePtr<perfetto::protos::gen::BeginFrameSourceState>::operator=
            (&this->begin_frame_source_state_,&param_1->begin_frame_source_state_);
  _Var1._M_head_impl =
       (param_1->compositor_timing_history_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::CompositorTimingHistory,_std::default_delete<perfetto::protos::gen::CompositorTimingHistory>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::CompositorTimingHistory_*,_std::default_delete<perfetto::protos::gen::CompositorTimingHistory>_>
       .super__Head_base<0UL,_perfetto::protos::gen::CompositorTimingHistory_*,_false>._M_head_impl;
  _Var2._M_head_impl =
       (this->compositor_timing_history_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::CompositorTimingHistory,_std::default_delete<perfetto::protos::gen::CompositorTimingHistory>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::CompositorTimingHistory_*,_std::default_delete<perfetto::protos::gen::CompositorTimingHistory>_>
       .super__Head_base<0UL,_perfetto::protos::gen::CompositorTimingHistory_*,_false>._M_head_impl;
  (_Var2._M_head_impl)->draw_estimate_delta_us_ = (_Var1._M_head_impl)->draw_estimate_delta_us_;
  iVar3 = (_Var1._M_head_impl)->begin_main_frame_queue_critical_estimate_delta_us_;
  iVar4 = (_Var1._M_head_impl)->begin_main_frame_queue_not_critical_estimate_delta_us_;
  iVar5 = (_Var1._M_head_impl)->begin_main_frame_start_to_ready_to_commit_estimate_delta_us_;
  iVar6 = (_Var1._M_head_impl)->commit_to_ready_to_activate_estimate_delta_us_;
  iVar7 = (_Var1._M_head_impl)->activate_estimate_delta_us_;
  (_Var2._M_head_impl)->prepare_tiles_estimate_delta_us_ =
       (_Var1._M_head_impl)->prepare_tiles_estimate_delta_us_;
  (_Var2._M_head_impl)->activate_estimate_delta_us_ = iVar7;
  (_Var2._M_head_impl)->begin_main_frame_start_to_ready_to_commit_estimate_delta_us_ = iVar5;
  (_Var2._M_head_impl)->commit_to_ready_to_activate_estimate_delta_us_ = iVar6;
  (_Var2._M_head_impl)->begin_main_frame_queue_critical_estimate_delta_us_ = iVar3;
  (_Var2._M_head_impl)->begin_main_frame_queue_not_critical_estimate_delta_us_ = iVar4;
  ::std::__cxx11::string::_M_assign((string *)&(_Var2._M_head_impl)->unknown_fields_);
  ((_Var2._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
       (_Base_bitset<1UL>)((_Var1._M_head_impl)->_has_field_).super__Base_bitset<1UL>._M_w;
  ::std::__cxx11::string::_M_assign((string *)&this->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

ChromeCompositorSchedulerState::ChromeCompositorSchedulerState(ChromeCompositorSchedulerState&&) noexcept = default;